

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O0

BOOL __thiscall Js::ModuleRoot::HasRootProperty(ModuleRoot *this,PropertyId propertyId)

{
  BOOL BVar1;
  HostObjectBase **ppHVar2;
  JavascriptLibrary *this_00;
  GlobalObject *this_01;
  PropertyId propertyId_local;
  ModuleRoot *this_local;
  
  BVar1 = RootObjectBase::HasRootProperty(&this->super_RootObjectBase,propertyId);
  if (BVar1 == 0) {
    ppHVar2 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                        ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
    if (*ppHVar2 != (HostObjectBase *)0x0) {
      ppHVar2 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                          ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
      BVar1 = Js::JavascriptOperators::HasProperty((RecyclableObject *)*ppHVar2,propertyId);
      if (BVar1 != 0) {
        return 1;
      }
    }
    this_00 = RecyclableObject::GetLibrary((RecyclableObject *)this);
    this_01 = JavascriptLibrary::GetGlobalObject(this_00);
    this_local._4_4_ = GlobalObject::HasRootProperty(this_01,propertyId);
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL ModuleRoot::HasRootProperty(PropertyId propertyId)
    {
        if (__super::HasRootProperty(propertyId))
        {
            return TRUE;
        }
        else if (this->hostObject && JavascriptOperators::HasProperty(this->hostObject, propertyId))
        {
            return TRUE;
        }
        return this->GetLibrary()->GetGlobalObject()->GlobalObject::HasRootProperty(propertyId);
    }